

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O1

SerializedData * __thiscall
Diligent::SerializedData::operator=(SerializedData *this,SerializedData *Rhs)

{
  IMemoryAllocator *pIVar1;
  
  pIVar1 = this->m_pAllocator;
  if (pIVar1 != (IMemoryAllocator *)0x0) {
    (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,this->m_Ptr);
  }
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  this->m_Ptr = (void *)0x0;
  this->m_Size = 0;
  LOCK();
  (this->m_Hash).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  this->m_pAllocator = Rhs->m_pAllocator;
  this->m_Ptr = Rhs->m_Ptr;
  this->m_Size = Rhs->m_Size;
  LOCK();
  (this->m_Hash).super___atomic_base<unsigned_long>._M_i =
       (Rhs->m_Hash).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  Rhs->m_Size = 0;
  Rhs->m_pAllocator = (IMemoryAllocator *)0x0;
  Rhs->m_Ptr = (void *)0x0;
  LOCK();
  (Rhs->m_Hash).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  return this;
}

Assistant:

SerializedData& SerializedData::operator=(SerializedData&& Rhs) noexcept
{
    Free();

    ASSERT_SIZEOF64(*this, 32, "Please handle new members here");

    m_pAllocator = Rhs.m_pAllocator;
    m_Ptr        = Rhs.m_Ptr;
    m_Size       = Rhs.m_Size;
    m_Hash.store(Rhs.m_Hash.load());

    Rhs.m_pAllocator = nullptr;
    Rhs.m_Ptr        = nullptr;
    Rhs.m_Size       = 0;
    Rhs.m_Hash.store(0);
    return *this;
}